

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

bool __thiscall Jupiter::File::addData(File *this,string_view data)

{
  iterator __begin1;
  basic_string_view<char,_std::char_traits<char>_> *__args;
  container_type lines;
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_58;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_30._M_str = data._M_str;
  local_30._M_len = data._M_len;
  local_40._M_len = 2;
  local_40._M_str = "\r\n";
  jessilib::
  word_split<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            ((container_type *)&local_58,&local_30,&local_40);
  __args = local_58._M_impl.super__Vector_impl_data._M_start;
  if (local_58._M_impl.super__Vector_impl_data._M_start !=
      local_58._M_impl.super__Vector_impl_data._M_finish) {
    for (; __args != local_58._M_impl.super__Vector_impl_data._M_finish; __args = __args + 1) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->m_data->lines,__args);
    }
  }
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&local_58);
  return local_58._M_impl.super__Vector_impl_data._M_start !=
         local_58._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool Jupiter::File::addData(std::string_view data) {
	auto lines = jessilib::word_split_view(data, "\r\n"sv);
	if (lines.empty()) {
		return false;
	}

	for (const auto& line : lines) {
		m_data->lines.emplace_back(line);
	}
	return true;
}